

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O2

void __thiscall
slang::ast::AssignmentExpression::visitExprs<slang::analysis::NonProceduralExprVisitor&>
          (AssignmentExpression *this,Result *visitor)

{
  if (this->timingControl != (TimingControl *)0x0) {
    TimingControl::visit<slang::analysis::NonProceduralExprVisitor>(this->timingControl,visitor);
  }
  Expression::visit<slang::analysis::NonProceduralExprVisitor&>(this->left_,visitor);
  Expression::visit<slang::analysis::NonProceduralExprVisitor&>(this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (timingControl)
            timingControl->visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }